

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O1

int __thiscall clask::_func_t::handle(_func_t *this,int s,request *req,bool *keep_alive)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  int iVar4;
  ostream *poVar5;
  mapped_type *pmVar6;
  long *plVar7;
  long *plVar8;
  char *pcVar9;
  size_type sVar10;
  pointer ppVar11;
  __string_type res_headers;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> res;
  ostringstream os;
  long *local_278;
  int local_270;
  undefined4 uStack_26c;
  long local_268 [2];
  int local_254;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  long *local_230 [2];
  long local_220 [2];
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  undefined1 local_1f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  pointer local_1b0;
  response_writer local_1a8 [2];
  ios_base local_138 [264];
  
  if ((this->f_string).super__Function_base._M_manager == (_Manager_type)0x0) {
    if ((this->f_writer).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_1a8[0]._vptr_response_writer = (_func_int **)&PTR_write_00142950;
      local_1a8[0].headers.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1a8[0].headers.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1a8[0].headers.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1a8[0].header_out = false;
      local_1a8[0].code = 200;
      local_1a8[0].s = s;
      (*(this->f_writer)._M_invoker)((_Any_data *)this,local_1a8,req);
      iVar4 = local_1a8[0].code;
      *keep_alive = false;
      local_1a8[0]._vptr_response_writer = (_func_int **)&PTR_write_00142950;
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_1a8[0].headers);
      return iVar4;
    }
    if ((this->f_response).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_254 = s;
      (*(this->f_response)._M_invoker)((response *)local_1f0,(_Any_data *)&this->f_response,req);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"HTTP/1.1 ",9);
      poVar5 = (ostream *)std::ostream::operator<<(local_1a8,local_1f0._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
      pmVar6 = std::__detail::
               _Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)status_codes_abi_cxx11_,(key_type *)local_1f0);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(pmVar6->_M_dataplus)._M_p,pmVar6->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\r\n",2);
      local_1b0 = local_1c8.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      if (local_1c8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_1c8.
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ppVar11 = local_1c8.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          sVar2 = (ppVar11->first)._M_string_length;
          if (sVar2 != 0) {
            sVar10 = 0;
            do {
              if (((sVar10 == 0) ||
                  (cVar1 = (ppVar11->first)._M_dataplus._M_p[sVar10 - 1], cVar1 == '-')) ||
                 (cVar1 == ' ')) {
                pcVar3 = (ppVar11->first)._M_dataplus._M_p;
                iVar4 = toupper((int)pcVar3[sVar10]);
                pcVar3[sVar10] = (char)iVar4;
              }
              sVar10 = sVar10 + 1;
            } while (sVar2 != sVar10);
          }
          std::__cxx11::string::substr((ulong)&local_278,(ulong)ppVar11);
          iVar4 = std::__cxx11::string::compare((char *)&local_278);
          if (iVar4 != 0) {
            local_230[0] = local_220;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_230,local_278,
                       CONCAT44(uStack_26c,local_270) + (long)local_278);
            std::__cxx11::string::append((char *)local_230);
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)local_230,(ulong)(ppVar11->second)._M_dataplus._M_p)
            ;
            plVar8 = plVar7 + 2;
            if ((long *)*plVar7 == plVar8) {
              local_200 = *plVar8;
              lStack_1f8 = plVar7[3];
              local_210 = &local_200;
            }
            else {
              local_200 = *plVar8;
              local_210 = (long *)*plVar7;
            }
            local_208 = plVar7[1];
            *plVar7 = (long)plVar8;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_210);
            local_250 = &local_240;
            plVar8 = plVar7 + 2;
            if ((long *)*plVar7 == plVar8) {
              local_240 = *plVar8;
              lStack_238 = plVar7[3];
            }
            else {
              local_240 = *plVar8;
              local_250 = (long *)*plVar7;
            }
            local_248 = plVar7[1];
            *plVar7 = (long)plVar8;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)local_250,local_248);
            if (local_250 != &local_240) {
              operator_delete(local_250,local_240 + 1);
            }
            if (local_210 != &local_200) {
              operator_delete(local_210,local_200 + 1);
            }
            if (local_230[0] != local_220) {
              operator_delete(local_230[0],local_220[0] + 1);
            }
          }
          if (local_278 != local_268) {
            operator_delete(local_278,local_268[0] + 1);
          }
          ppVar11 = ppVar11 + 1;
        } while (ppVar11 != local_1b0);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Content-Length: ",0x10);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\r\n\r\n",4);
      std::__cxx11::stringbuf::str();
      send(local_254,local_278,(long)local_270,0x4000);
      if (local_278 != local_268) {
        operator_delete(local_278,local_268[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_1c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1f0._12_4_,local_1f0._8_4_) == &local_1d8) {
        return local_1f0._0_4_;
      }
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_1f0._12_4_,local_1f0._8_4_),local_1d8._0_8_ + 1);
      return local_1f0._0_4_;
    }
  }
  else {
    (*(this->f_string)._M_invoker)
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f0,
               (_Any_data *)&this->f_string,req);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"HTTP/1.1 200 OK\r\nContent-Type: text/plain; charset=UTF-8\r\n"
               ,0x3a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Connection: ",0xc);
    pcVar9 = "Close";
    if ((ulong)*keep_alive != 0) {
      pcVar9 = "Keep-Alive";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,pcVar9,(ulong)*keep_alive * 5 + 5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\r\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Content-Length: ",0x10)
    ;
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\r\n\r\n",4);
    std::__cxx11::stringbuf::str();
    send(s,local_278,(long)local_270,0x4000);
    send(s,(void *)CONCAT44(local_1f0._4_4_,local_1f0._0_4_),(long)(int)local_1f0._8_4_,0x4000);
    if (local_278 != local_268) {
      operator_delete(local_278,local_268[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((undefined1 *)CONCAT44(local_1f0._4_4_,local_1f0._0_4_) != local_1f0 + 0x10) {
      operator_delete((undefined1 *)CONCAT44(local_1f0._4_4_,local_1f0._0_4_),local_1f0._16_8_ + 1);
    }
  }
  return 200;
}

Assistant:

inline int func_t::handle(int s, request& req, bool& keep_alive) const {
  int code = 200;
  if (f_string != nullptr) {
    auto res = f_string(req);
    std::ostringstream os;
    os << "HTTP/1.1 200 OK\r\nContent-Type: text/plain; charset=UTF-8\r\n";
    os << "Connection: " << (keep_alive ? "Keep-Alive" : "Close") << "\r\n";
    os << "Content-Length: " << res.size() << "\r\n\r\n";
    auto res_headers = os.str();
    send(s, res_headers.data(), (int) res_headers.size(), MSG_NOSIGNAL);
    send(s, res.data(), (int) res.size(), MSG_NOSIGNAL);
  } else if (f_writer != nullptr) {
    response_writer writer(s, 200);
    f_writer(writer, req);
    keep_alive = false;
    code = writer.code;
  } else if (f_response != nullptr) {
    auto res = f_response(req);
    std::ostringstream os;
    os << "HTTP/1.1 " << res.code << " " << status_codes[res.code] << "\r\n";
    for (auto& h : res.headers) {
      auto key = camelize(h.first);
      if (key == "Content-Length")
        continue;
      os << key + ": " + h.second + "\r\n";
    }
    os << "Content-Length: " << res.content.size() << "\r\n\r\n";
    auto res_headers = os.str();
    send(s, res_headers.data(), (int) res_headers.size(), MSG_NOSIGNAL);
    code = res.code;
  }
  return code;
}